

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-ctest.c
# Opt level: O0

void test02(char *infile,char *password,char *outfile,char *xarg)

{
  uint uVar1;
  char *xarg_local;
  char *outfile_local;
  char *password_local;
  char *infile_local;
  
  qpdf_set_suppress_warnings(qpdf,1);
  uVar1 = qpdf_read(qpdf,infile,password);
  if ((uVar1 & 2) == 0) {
    uVar1 = qpdf_init_write(qpdf,outfile);
    if ((uVar1 & 2) == 0) {
      qpdf_set_static_ID(qpdf,1);
      qpdf_write(qpdf);
    }
  }
  report_errors();
  return;
}

Assistant:

static void
test02(char const* infile, char const* password, char const* outfile, char const* xarg)
{
    qpdf_set_suppress_warnings(qpdf, QPDF_TRUE);
    if (((qpdf_read(qpdf, infile, password) & QPDF_ERRORS) == 0) &&
        ((qpdf_init_write(qpdf, outfile) & QPDF_ERRORS) == 0)) {
        qpdf_set_static_ID(qpdf, QPDF_TRUE);
        qpdf_write(qpdf);
    }
    report_errors();
}